

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-textblock.c
# Opt level: O3

void text_out_e(char *fmt,...)

{
  char *__s;
  char in_AL;
  uint8_t uVar1;
  int iVar2;
  char *pcVar3;
  ushort **ppuVar4;
  char *pcVar5;
  size_t __n;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *pcVar6;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar7;
  byte bVar8;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char tagbuffer [16];
  va_list vp;
  char smallbuf [1024];
  char buf [1024];
  char local_918 [16];
  __va_list_tag local_908;
  undefined1 local_8e8 [8];
  undefined8 local_8e0;
  undefined8 local_8d8;
  undefined8 local_8d0;
  undefined8 local_8c8;
  undefined8 local_8c0;
  undefined8 local_8b8;
  undefined8 local_8a8;
  undefined8 local_898;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  undefined8 local_848;
  char local_838 [1024];
  char local_438 [1032];
  
  local_908.reg_save_area = local_8e8;
  if (in_AL != '\0') {
    local_8b8 = in_XMM0_Qa;
    local_8a8 = in_XMM1_Qa;
    local_898 = in_XMM2_Qa;
    local_888 = in_XMM3_Qa;
    local_878 = in_XMM4_Qa;
    local_868 = in_XMM5_Qa;
    local_858 = in_XMM6_Qa;
    local_848 = in_XMM7_Qa;
  }
  local_908.overflow_arg_area = &stack0x00000008;
  local_908.gp_offset = 8;
  local_908.fp_offset = 0x30;
  local_8e0 = in_RSI;
  local_8d8 = in_RDX;
  local_8d0 = in_RCX;
  local_8c8 = in_R8;
  local_8c0 = in_R9;
  vstrnfmt(local_438,0x400,fmt,&local_908);
  __s = local_438;
  do {
    if (local_438[0] == '\0') {
      return;
    }
    pcVar3 = strchr(__s,0x7b);
    while( true ) {
      if ((pcVar3 == (char *)0x0) || (bVar8 = pcVar3[1], bVar8 == 0)) goto LAB_001f9ef5;
      ppuVar4 = __ctype_b_loc();
      pcVar6 = local_838;
      lVar7 = 0;
      while ((*(byte *)((long)*ppuVar4 + (ulong)bVar8 * 2 + 1) & 0x24) != 0) {
        bVar8 = pcVar3[lVar7 + 2];
        lVar7 = lVar7 + 1;
        pcVar6 = pcVar6 + -1;
        if (bVar8 == 0) goto LAB_001f9ef5;
      }
      if (bVar8 == 0x7d) break;
      pcVar3 = strchr(pcVar3 + 1,0x7b);
    }
    pcVar5 = strstr(pcVar3 + lVar7 + 1,"{/}");
    if (pcVar5 != (char *)0x0) {
      __n = (long)pcVar3 - (long)__s;
      if (__n != 0) goto LAB_001f9f00;
      memcpy(local_838,pcVar3 + lVar7 + 2,(size_t)(pcVar5 + ((-2 - (long)pcVar3) - lVar7)));
      pcVar6[(long)(pcVar5 + (-2 - (long)pcVar3))] = '\0';
      if ((char *)0xf < pcVar3 + (lVar7 - (long)__s)) {
        __assert_fail("taglen < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-textblock.c"
                      ,0x2a6,"void text_out_e(const char *, ...)");
      }
      pcVar5 = pcVar5 + 3;
      memcpy(local_918,__s + 1,(size_t)(pcVar3 + (lVar7 - (long)__s)));
      pcVar3[(long)(local_918 + (lVar7 - (long)__s))] = '\0';
      iVar2 = color_text_to_attr(local_918);
      if (iVar2 == -1) {
        iVar2 = 1;
      }
      uVar1 = (uint8_t)iVar2;
      goto LAB_001f9f25;
    }
LAB_001f9ef5:
    __n = strlen(__s);
LAB_001f9f00:
    pcVar5 = __s + __n;
    memcpy(local_838,__s,__n);
    local_838[__n] = '\0';
    uVar1 = '\x01';
LAB_001f9f25:
    (*text_out_hook)(uVar1,local_838);
    local_438[0] = *pcVar5;
    __s = pcVar5;
  } while( true );
}

Assistant:

void text_out_e(const char *fmt, ...)
{
	char buf[1024];
	char smallbuf[1024];
	va_list vp;

	const char *start, *next, *text, *tag;
	size_t textlen, taglen = 0;

	/* Begin the Varargs Stuff */
	va_start(vp, fmt);

	/* Do the va_arg fmt to the buffer */
	(void)vstrnfmt(buf, sizeof(buf), fmt, vp);

	/* End the Varargs Stuff */
	va_end(vp);

	start = buf;
	while (next_section(start, 0, &text, &textlen, &tag, &taglen, &next)) {
		int a = -1;

		memcpy(smallbuf, text, textlen);
		smallbuf[textlen] = 0;

		if (tag) {
			char tagbuffer[16];

			/* Colour names are less than 16 characters long. */
			assert(taglen < 16);

			memcpy(tagbuffer, tag, taglen);
			tagbuffer[taglen] = '\0';

			a = color_text_to_attr(tagbuffer);
		}
		
		if (a == -1) 
			a = COLOUR_WHITE;

		/* Output now */
		text_out_hook(a, smallbuf);

		start = next;
	}
}